

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroStoreUnaligned
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  element_type *peVar1;
  CAssemblerCommand *this;
  undefined4 in_register_0000000c;
  char *pcVar2;
  uint in_R8D;
  uint uVar3;
  long lVar4;
  long *plVar5;
  initializer_list<AssemblyTemplateArgument> variables;
  string op;
  string size;
  string macroText;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  undefined1 *local_138;
  char *local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  string local_118;
  char *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  char *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  char *local_a8;
  string local_a0;
  char *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = 0;
  local_138 = &local_128;
  local_130 = (char *)0x0;
  local_128 = 0;
  uVar3 = in_R8D & 0xf;
  if (uVar3 == 3) {
    pcVar2 = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\tsb\t\t%rd%,%off%(%rs%)\n\t\t\t\tsrl\t\tr1,%rd%,8\n\t\t\t\tsb\t\tr1,%off%+1(%rs%)\n\t\t\t.endif\n\t\t"
    ;
  }
  else {
    if ((uVar3 | 2) != 7) {
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_0018247c;
    }
    if ((immediates->secondary).type ==
        *(MipsImmediateType *)
         &immediates[1].secondary.expression.expression.
          super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
      Logger::printError<>(Error,"Cannot use same register as source and destination");
      this = (CAssemblerCommand *)operator_new(0x18);
      this->_vptr_CAssemblerCommand = (_func_int **)0x0;
      this->FileNum = 0;
      this->FileLine = 0;
      *(undefined8 *)&this->section = 0;
      CAssemblerCommand::CAssemblerCommand(this);
      this->_vptr_CAssemblerCommand = (_func_int **)&PTR__CAssemblerCommand_001bc968;
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)this;
      goto LAB_0018247c;
    }
    pcVar2 = "usd";
    if (uVar3 == 5) {
      pcVar2 = "usw";
    }
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,(ulong)(pcVar2 + 1));
    pcVar2 = "8";
    if (uVar3 == 5) {
      pcVar2 = "4";
    }
    std::__cxx11::string::_M_replace((ulong)&local_138,0,local_130,(ulong)pcVar2);
    pcVar2 = 
    "\n\t\t\t.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)\n\t\t\t\t.error \"Immediate offset too big\"\n\t\t\t.else\n\t\t\t\t%op%l\t%rd%,%off%+%size%-1(%rs%)\n\t\t\t\t%op%r\t%rd%,%off%(%rs%)\n\t\t\t.endif\n\t\t"
    ;
  }
  preprocessMacro_abi_cxx11_
            (&local_118,pcVar2,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_f8 = "%rs%";
  local_f0[0] = local_e0;
  peVar1 = (immediates->primary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,peVar1,
             (long)&((immediates->primary).expression.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  local_d0 = "%rd%";
  local_c8[0] = local_b8;
  lVar4 = *(long *)&immediates[1].primary.expression.constExpression;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,lVar4,*(long *)&immediates[1].primary.value + lVar4);
  local_a8 = "%off%";
  Expression::toString_abi_cxx11_
            (&local_a0,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->primary).expression);
  local_80 = "%op%";
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_158,local_158 + local_150);
  local_58 = "%size%";
  plVar5 = local_40;
  local_50[0] = plVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,local_138,local_130 + (long)local_138);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_f8;
  createMacro(parser,(string *)registers,(int)&local_118,variables);
  lVar4 = -200;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
LAB_0018247c:
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroStoreUnaligned(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	std::string op, size;
	int type = flags & MIPSM_ACCESSMASK;
	if (type == MIPSM_HW)
	{
		const char* templateHalfword = R"(
			.if (%off% < 0x8000) && ((%off%+1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				sb		%rd%,%off%(%rs%)
				srl		r1,%rd%,8
				sb		r1,%off%+1(%rs%)
			.endif
		)";

		selectedTemplate = templateHalfword;
	} else if (type == MIPSM_W || type == MIPSM_DW)
	{
		const char* templateWord = R"(
			.if (%off% < 0x8000) && ((%off%+%size%-1) >= 0x8000)
				.error "Immediate offset too big"
			.else
				%op%l	%rd%,%off%+%size%-1(%rs%)
				%op%r	%rd%,%off%(%rs%)
			.endif
		)";

		if (registers.grs.num == registers.grd.num)
		{
			Logger::printError(Logger::Error, "Cannot use same register as source and destination");
			return std::make_unique<DummyCommand>();
		}

		op = type == MIPSM_W ? "sw" : "sd";
		size = type == MIPSM_W ? "4" : "8";
		selectedTemplate = templateWord;
	} else {
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rs%",		registers.grs.name.string() },
			{ "%rd%",		registers.grd.name.string() },
			{ "%off%",		immediates.primary.expression.toString() },
			{ "%op%",		op },
			{ "%size%",	size },
	});
}